

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O2

void __thiscall
ezc3d::c3d::analog(c3d *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *channelNames)

{
  size_t sVar1;
  Analogs *this_00;
  size_t i;
  ulong uVar2;
  size_t f;
  Channel emptyChannel;
  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> dummy_frames;
  SubFrame dummy_subframes;
  Frame frame;
  
  sVar1 = DataNS::Data::nbFrames
                    ((this->_data).
                     super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (sVar1 == 0) {
    frame._points.super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    frame._points.super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    frame._analogs.super___shared_ptr<ezc3d::DataNS::AnalogsNS::Analogs,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    updateParameters(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&frame,channelNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&frame);
  }
  else {
    dummy_frames.super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dummy_frames.super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dummy_frames.super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DataNS::AnalogsNS::SubFrame::SubFrame(&dummy_subframes);
    DataNS::AnalogsNS::Channel::Channel(&emptyChannel);
    DataNS::AnalogsNS::Channel::data(&emptyChannel,0.0);
    DataNS::Frame::Frame(&frame);
    for (uVar2 = 0;
        uVar2 < (ulong)((long)(channelNames->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(channelNames->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
      DataNS::AnalogsNS::SubFrame::channel(&dummy_subframes,&emptyChannel,0xffffffffffffffff);
    }
    uVar2 = 0;
    while( true ) {
      sVar1 = Header::nbAnalogByFrame
                        ((this->_header).
                         super___shared_ptr<ezc3d::Header,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (sVar1 <= uVar2) break;
      this_00 = DataNS::Frame::analogs(&frame);
      DataNS::AnalogsNS::Analogs::subframe(this_00,&dummy_subframes,0xffffffffffffffff);
      uVar2 = uVar2 + 1;
    }
    uVar2 = 0;
    while( true ) {
      sVar1 = DataNS::Data::nbFrames
                        ((this->_data).
                         super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if (sVar1 <= uVar2) break;
      std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::push_back
                (&dummy_frames,&frame);
      uVar2 = uVar2 + 1;
    }
    analog(this,channelNames,&dummy_frames);
    DataNS::Frame::~Frame(&frame);
    std::
    _Vector_base<ezc3d::DataNS::AnalogsNS::Channel,_std::allocator<ezc3d::DataNS::AnalogsNS::Channel>_>
    ::~_Vector_base((_Vector_base<ezc3d::DataNS::AnalogsNS::Channel,_std::allocator<ezc3d::DataNS::AnalogsNS::Channel>_>
                     *)&dummy_subframes);
    std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::~vector(&dummy_frames)
    ;
  }
  return;
}

Assistant:

void ezc3d::c3d::analog(const std::vector<std::string> &channelNames) {
  if (data().nbFrames() > 0) {
    std::vector<ezc3d::DataNS::Frame> dummy_frames;
    ezc3d::DataNS::AnalogsNS::SubFrame dummy_subframes;
    ezc3d::DataNS::AnalogsNS::Channel emptyChannel;
    emptyChannel.data(0);
    ezc3d::DataNS::Frame frame;
    for (size_t i = 0; i < channelNames.size(); ++i) {
      dummy_subframes.channel(emptyChannel);
    }
    for (size_t sf = 0; sf < header().nbAnalogByFrame(); ++sf)
      frame.analogs().subframe(dummy_subframes);
    for (size_t f = 0; f < data().nbFrames(); ++f)
      dummy_frames.push_back(frame);
    analog(channelNames, dummy_frames);
  } else {
    updateParameters({}, channelNames);
  }
}